

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::peer_connection::incoming_dht_port(peer_connection *this,int listen_port)

{
  session_interface *psVar1;
  in4_addr_type iVar2;
  bool bVar3;
  address local_60;
  basic_endpoint<boost::asio::ip::udp> local_3c;
  
  iVar2.s_addr = 0;
  peer_log(this,incoming_message,"DHT_PORT","p: %d",listen_port);
  psVar1 = (this->super_peer_connection_hot_members).m_ses;
  bVar3 = (this->m_remote).impl_.data_.base.sa_family != 2;
  if (bVar3) {
    local_60.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 8);
    local_60.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(this->m_remote).impl_.data_ + 0x10);
    local_60.ipv6_address_.scope_id_ = (unsigned_long)(this->m_remote).impl_.data_.v6.sin6_scope_id;
  }
  else {
    iVar2.s_addr = (this->m_remote).impl_.data_.v4.sin_addr.s_addr;
    local_60.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    local_60.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_60.ipv6_address_.scope_id_ = 0;
  }
  local_60.type_ = (anon_enum_32)bVar3;
  local_60.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)iVar2.s_addr;
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            (&local_3c,&local_60,(unsigned_short)listen_port);
  (*(psVar1->super_session_logger)._vptr_session_logger[0x46])(psVar1,&local_3c);
  return;
}

Assistant:

void peer_connection::incoming_dht_port(int const listen_port)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::incoming_message, "DHT_PORT", "p: %d", listen_port);
#endif
#ifndef TORRENT_DISABLE_DHT
		m_ses.add_dht_node({m_remote.address(), std::uint16_t(listen_port)});
#else
		TORRENT_UNUSED(listen_port);
#endif
	}